

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O2

pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* helics::core::extractCoreType
            (pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *configureString)

{
  element_type *peVar1;
  ConfigType CVar2;
  CoreType CVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *pcVar4;
  string_view type;
  string_view configString;
  helicsCLI11App *local_280;
  shared_ptr<helics::HelicsConfigJSON> dptr;
  string corestring;
  string namestring;
  istringstream jstring;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_220 [64];
  
  corestring._M_dataplus._M_p = (pointer)&corestring.field_2;
  corestring._M_string_length = 0;
  corestring.field_2._M_local_buf[0] = '\0';
  namestring._M_dataplus._M_p = (pointer)&namestring.field_2;
  namestring._M_string_length = 0;
  namestring.field_2._M_local_buf[0] = '\0';
  anon_unknown_5::makeCLITypeApp((anon_unknown_5 *)&local_280,&corestring,&namestring);
  configString._M_str = (configureString->_M_dataplus)._M_p;
  configString._M_len = configureString->_M_string_length;
  CVar2 = fileops::getConfigType(configString);
  pcVar4 = extraout_RDX;
  switch(CVar2) {
  case JSON_STRING:
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&jstring,(string *)configureString,_S_in);
    CLI::App::parse_from_stream(&local_280->super_App,(istream *)&jstring);
    std::__cxx11::istringstream::~istringstream((istringstream *)&jstring);
    pcVar4 = extraout_RDX_00;
    break;
  case JSON_FILE:
    std::ifstream::ifstream(&jstring,(string *)configureString,_S_in);
    CLI::App::parse_from_stream(&local_280->super_App,(istream *)&jstring);
    std::ifstream::~ifstream(&jstring);
    pcVar4 = extraout_RDX_03;
    break;
  case TOML_STRING:
    (local_280->super_App).allow_extras_ = true;
    std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>((shared_ptr<CLI::Config> *)&jstring);
    peVar1 = _jstring;
    dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_ptr = _jstring;
    dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_220[0]._M_pi;
    _jstring = (element_type *)0x0;
    a_Stack_220[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_220);
    if (peVar1 != (element_type *)0x0) {
      peVar1->mSkipJson = true;
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&jstring,(string *)configureString,_S_in);
    CLI::App::parse_from_stream(&local_280->super_App,(istream *)&jstring);
    std::__cxx11::istringstream::~istringstream((istringstream *)&jstring);
    goto LAB_002e8dac;
  case TOML_FILE:
    (local_280->super_App).allow_extras_ = true;
    std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>((shared_ptr<CLI::Config> *)&jstring);
    peVar1 = _jstring;
    dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_ptr = _jstring;
    dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_220[0]._M_pi;
    _jstring = (element_type *)0x0;
    a_Stack_220[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_220);
    if (peVar1 != (element_type *)0x0) {
      peVar1->mSkipJson = true;
    }
    std::ifstream::ifstream(&jstring,(string *)configureString,_S_in);
    CLI::App::parse_from_stream(&local_280->super_App,(istream *)&jstring);
    std::ifstream::~ifstream(&jstring);
LAB_002e8dac:
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pcVar4 = extraout_RDX_02;
    break;
  case CMD_LINE:
    helicsCLI11App::helics_parse<std::__cxx11::string_const&>(local_280,configureString);
    pcVar4 = extraout_RDX_01;
  }
  if (corestring._M_string_length == 0) {
    __return_storage_ptr__->first = DEFAULT;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->second,&namestring);
  }
  else {
    type._M_str = pcVar4;
    type._M_len = (size_t)corestring._M_dataplus._M_p;
    CVar3 = coreTypeFromString((core *)corestring._M_string_length,type);
    __return_storage_ptr__->first = CVar3;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->second,&namestring);
  }
  if (local_280 != (helicsCLI11App *)0x0) {
    (*(local_280->super_App)._vptr_App[1])();
  }
  std::__cxx11::string::~string((string *)&namestring);
  std::__cxx11::string::~string((string *)&corestring);
  return __return_storage_ptr__;
}

Assistant:

std::pair<CoreType, std::string> extractCoreType(const std::string& configureString)
{
    std::string corestring;
    std::string namestring;
    auto app = makeCLITypeApp(corestring, namestring);
    auto type = fileops::getConfigType(configureString);
    try {
        switch (type) {
            case fileops::ConfigType::JSON_FILE: {
                std::ifstream file{configureString};
                app->parse_from_stream(file);
                break;
            }
            case fileops::ConfigType::JSON_STRING: {
                std::istringstream jstring{configureString};
                app->parse_from_stream(jstring);
                break;
            }
            case fileops::ConfigType::TOML_FILE: {
                app->allow_extras();
                auto dptr =
                    std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
                if (dptr) {
                    dptr->skipJson(true);
                }
                std::ifstream file{configureString};
                app->parse_from_stream(file);
                break;
            }
            case fileops::ConfigType::TOML_STRING: {
                app->allow_extras();
                auto dptr =
                    std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
                if (dptr) {
                    dptr->skipJson(true);
                }
                std::istringstream tstring{configureString};
                app->parse_from_stream(tstring);
                break;
            }
            case fileops::ConfigType::CMD_LINE:
                app->helics_parse(configureString);
                break;
            case fileops::ConfigType::NONE:
                break;
        }
    }
    catch (const std::exception&) {
        corestring.clear();
    }
    if (corestring.empty()) {
        return {CoreType::DEFAULT, namestring};
    }
    return {coreTypeFromString(corestring), namestring};
}